

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_add_child_tail(isoent *parent,isoent *child)

{
  int iVar1;
  isoent *child_local;
  isoent *parent_local;
  
  iVar1 = __archive_rb_tree_insert_node(&parent->rbtree,&child->rbnode);
  if (iVar1 == 0) {
    parent_local._4_4_ = 0;
  }
  else {
    child->chnext = (isoent *)0x0;
    *(parent->children).last = child;
    (parent->children).last = &child->chnext;
    (parent->children).cnt = (parent->children).cnt + 1;
    child->parent = parent;
    child->drnext = (isoent *)0x0;
    if ((char)(child->field_0xe8 << 6) < '\0') {
      *(parent->subdirs).last = child;
      (parent->subdirs).last = &child->drnext;
      (parent->subdirs).cnt = (parent->subdirs).cnt + 1;
      child->parent = parent;
    }
    parent_local._4_4_ = 1;
  }
  return parent_local._4_4_;
}

Assistant:

static int
isoent_add_child_tail(struct isoent *parent, struct isoent *child)
{

	if (!__archive_rb_tree_insert_node(
	    &(parent->rbtree), (struct archive_rb_node *)child))
		return (0);
	child->chnext = NULL;
	*parent->children.last = child;
	parent->children.last = &(child->chnext);
	parent->children.cnt++;
	child->parent = parent;

	/* Add a child to a sub-directory chain */
	child->drnext = NULL;
	if (child->dir) {
		*parent->subdirs.last = child;
		parent->subdirs.last = &(child->drnext);
		parent->subdirs.cnt++;
		child->parent = parent;
	}
	return (1);
}